

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O2

string * miniros::names::resolve(string *__return_storage_ptr__,string *ns,string *name,bool _remap)

{
  bool bVar1;
  char cVar2;
  string *left;
  InvalidNameException *this;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string error;
  string local_40;
  
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  bVar1 = validate(name,&error);
  if (!bVar1) {
    this = (InvalidNameException *)__cxa_allocate_exception(0x10);
    InvalidNameException::InvalidNameException(this,&error);
    __cxa_throw(this,&InvalidNameException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (name->_M_string_length == 0) {
    if (ns->_M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"/",(allocator<char> *)&local_a0);
      goto LAB_00232d08;
    }
    if (*(ns->_M_dataplus)._M_p == '/') {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)ns);
      goto LAB_00232d08;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"/",(allocator<char> *)&local_80);
    append(__return_storage_ptr__,&local_a0,ns);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
    cVar2 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    if (cVar2 == '~') {
      left = this_node::getName_abi_cxx11_();
      std::__cxx11::string::substr((ulong)&local_80,(ulong)__return_storage_ptr__);
      append(&local_a0,left,&local_80);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      cVar2 = *(__return_storage_ptr__->_M_dataplus)._M_p;
    }
    if (cVar2 != '/') {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"/",&local_a1);
      append(&local_40,ns,__return_storage_ptr__);
      append(&local_a0,&local_80,&local_40);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_80);
    }
    clean(&local_a0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (!_remap) goto LAB_00232d08;
    remap(&local_a0,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_a0);
  }
  std::__cxx11::string::~string((string *)&local_a0);
LAB_00232d08:
  std::__cxx11::string::~string((string *)&error);
  return __return_storage_ptr__;
}

Assistant:

std::string resolve(const std::string& ns, const std::string& name, bool _remap)
{
  std::string error;
  if (!validate(name, error))
  {
    throw InvalidNameException(error);
  }

  if (name.empty())
  {
    if (ns.empty())
    {
      return "/";
    }

    if (ns[0] == '/')
    {
      return ns;
    }

    return append("/", ns);
  }

  std::string copy = name;

  if (copy[0] == '~')
  {
    copy = append(this_node::getName(), copy.substr(1));
  }

  if (copy[0] != '/')
  {
    copy = append("/", append(ns, copy));
  }

  copy = clean(copy);

  if (_remap)
  {
    copy = remap(copy);
  }

  return copy;
}